

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O2

ggml_float ggml_vec_soft_max_f32(int n,float *y,float *x,float max)

{
  undefined1 auVar1 [16];
  __m512 x_00;
  undefined1 auVar2 [64];
  undefined4 in_register_0000003c;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined8 in_stack_ffffffffffffff78;
  double dVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [32];
  undefined1 auStack_48 [32];
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = max;
  auVar11 = in_register_00001204._0_12_;
  auVar6 = vbroadcastss_avx512f(auVar6._0_16_);
  lVar4 = (long)n;
  lVar3 = 0;
  auVar12 = auVar6._0_32_;
  auStack_48 = auVar6._32_32_;
  dVar10 = 0.0;
  while (lVar3 + 0xf < lVar4) {
    auVar2._32_32_ = auStack_48;
    auVar2._0_32_ = auVar12;
    auVar6 = vsubps_avx512f(*(undefined1 (*) [64])(x + lVar3),auVar2);
    x_00._8_8_ = dVar10;
    x_00[0] = (float)(int)in_stack_ffffffffffffff78;
    x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    x_00[4] = max;
    x_00[5] = (float)auVar11._0_4_;
    x_00[6] = (float)auVar11._4_4_;
    x_00[7] = (float)auVar11._8_4_;
    x_00[8] = (float)auVar12._0_4_;
    x_00[9] = (float)auVar12._4_4_;
    x_00[10] = (float)auVar12._8_4_;
    x_00[0xb] = (float)auVar12._12_4_;
    x_00[0xc] = (float)auVar12._16_4_;
    x_00[0xd] = (float)auVar12._20_4_;
    x_00[0xe] = (float)auVar12._24_4_;
    x_00[0xf] = (float)auVar12._28_4_;
    ggml_v_expf((__m512 *)CONCAT44(in_register_0000003c,n),x_00);
    auVar5 = vextractf64x4_avx512f(auVar6,1);
    *(undefined1 (*) [64])(y + lVar3) = auVar6;
    lVar3 = lVar3 + 0x10;
    auVar6 = vaddps_avx512f(auVar6,ZEXT3264(auVar5));
    auVar8._0_4_ = auVar6._0_4_ + auVar6._16_4_;
    auVar8._4_4_ = auVar6._4_4_ + auVar6._20_4_;
    auVar8._8_4_ = auVar6._8_4_ + auVar6._24_4_;
    auVar8._12_4_ = auVar6._12_4_ + auVar6._28_4_;
    auVar1 = vshufpd_avx(auVar8,auVar8,1);
    auVar9._0_4_ = auVar8._0_4_ + auVar1._0_4_;
    auVar9._4_4_ = auVar8._4_4_ + auVar1._4_4_;
    auVar9._8_4_ = auVar8._8_4_ + auVar1._8_4_;
    auVar9._12_4_ = auVar8._12_4_ + auVar1._12_4_;
    auVar1 = vhaddps_avx(auVar9,auVar9);
    dVar10 = dVar10 + (double)auVar1._0_4_;
  }
  for (; lVar3 < lVar4; lVar3 = lVar3 + 1) {
    fVar7 = expf(x[lVar3] - max);
    y[lVar3] = fVar7;
    dVar10 = dVar10 + (double)fVar7;
  }
  return dVar10;
}

Assistant:

ggml_float ggml_vec_soft_max_f32(const int n, float * y, const float * x, float max) {
    int i = 0;
    ggml_float sum = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        __m512 val = ggml_v_expf(_mm512_sub_ps(_mm512_loadu_ps(x + i),
                                               _mm512_set1_ps(max)));
        _mm512_storeu_ps(y + i, val);
        sum += (ggml_float)_mm512_reduce_add_ps(val);
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        __m256 val = ggml_v_expf(_mm256_sub_ps(_mm256_loadu_ps(x + i),
                                               _mm256_set1_ps(max)));
        _mm256_storeu_ps(y + i, val);
        __m128 val2 = _mm_add_ps(_mm256_extractf128_ps(val, 1),
                                 _mm256_castps256_ps128(val));
        val2 = _mm_add_ps(val2, _mm_movehl_ps(val2, val2));
        val2 = _mm_add_ss(val2, _mm_movehdup_ps(val2));
        sum += (ggml_float)_mm_cvtss_f32(val2);
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        __m128 val = ggml_v_expf(_mm_sub_ps(_mm_loadu_ps(x + i),
                                            _mm_set1_ps(max)));
        _mm_storeu_ps(y + i, val);
#if defined(__AVX__) || defined(__AVX2__) || defined(__AVX512F__)
        val = _mm_add_ps(val, _mm_movehl_ps(val, val));
        val = _mm_add_ss(val, _mm_movehdup_ps(val));
#else
        __m128 tmp = _mm_shuffle_ps(val, val, _MM_SHUFFLE(2, 3, 0, 1));
        val = _mm_add_ps(val, tmp);
        tmp = _mm_movehl_ps(tmp, val);
        val = _mm_add_ss(val, tmp);
#endif
        sum += (ggml_float)_mm_cvtss_f32(val);
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        float32x4_t val = ggml_v_expf(vsubq_f32(vld1q_f32(x + i),
                                                vdupq_n_f32(max)));
        vst1q_f32(y + i, val);
        sum += (ggml_float)vaddvq_f32(val);
    }
#endif
    for (; i < n; ++i) {
        float val = expf(x[i] - max);
        sum += (ggml_float)val;
        y[i] = val;
    }
    return sum;
}